

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O2

void __thiscall audiofft::OouraFFT::fft(OouraFFT *this,float *data,float *re,float *im)

{
  double *pdVar1;
  size_t sVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  
  detail::ConvertBuffer<double,float>
            ((this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,data,this->_size);
  rdft(this,(int)this->_size,1,
       (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start,
       (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
  sVar2 = this->_size;
  pdVar4 = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  for (lVar5 = sVar2 * 8; lVar5 != 0; lVar5 = lVar5 + -0x10) {
    *(float *)((long)re + lVar6) = (float)*pdVar4;
    pdVar1 = pdVar4 + 1;
    pdVar4 = pdVar4 + 2;
    *(float *)((long)im + lVar6) = -(float)*pdVar1;
    lVar6 = lVar6 + 4;
  }
  uVar3 = sVar2 * 2 & 0xfffffffffffffffc;
  *(float *)((long)re + uVar3) = -*im;
  *im = 0.0;
  *(undefined4 *)((long)im + uVar3) = 0;
  return;
}

Assistant:

virtual void fft(const float* data, float* re, float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          detail::ConvertBuffer(_buffer.data(), data, _size);

          rdft(static_cast<int>(_size), +1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            float *r = re;
            float *i = im;
            while (b != bEnd)
            {
              *(r++) = static_cast<float>(*(b++));
              *(i++) = static_cast<float>(-(*(b++)));
            }
          }
          const size_t size2 = _size / 2;
          re[size2] = -im[0];
          im[0] = 0.0;
          im[size2] = 0.0;
        }